

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
          (SourceLocationCommentPrinter *this)

{
  SourceLocationCommentPrinter *this_local;
  
  std::__cxx11::string::~string((string *)&this->prefix_);
  SourceLocation::~SourceLocation(&this->source_loc_);
  return;
}

Assistant:

SourceLocationCommentPrinter(const DescType* desc,
                               const string& prefix,
                               const DebugStringOptions& options)
      : options_(options), prefix_(prefix) {
    // Perform the SourceLocation lookup only if we're including user comments,
    // because the lookup is fairly expensive.
    have_source_loc_ = options.include_comments &&
        desc->GetSourceLocation(&source_loc_);
  }